

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tree.cpp
# Opt level: O0

Am_Wrapper * find_prev_child_proc(Am_Object *self)

{
  bool bVar1;
  byte bVar2;
  int iVar3;
  int iVar4;
  Am_Value *pAVar5;
  Am_Object local_50 [8];
  Am_Object item;
  Am_Object local_38 [8];
  Am_Value_List local_30 [8];
  Am_Value_List nodes;
  int parent_rank;
  int rank;
  Am_Object *self_local;
  
  pAVar5 = (Am_Value *)Am_Object::Get((ushort)self,0x85);
  iVar3 = Am_Value::operator_cast_to_int(pAVar5);
  pAVar5 = (Am_Value *)Am_Object::Get((ushort)self,(ulong)PARENT);
  iVar4 = Am_Value::operator_cast_to_int(pAVar5);
  if (iVar3 == iVar4) {
    self_local = (Am_Object *)Am_Object::operator_cast_to_Am_Wrapper_((Am_Object *)&Am_No_Object);
  }
  else {
    Am_Object::Get_Owner(local_38,(Am_Slot_Flags)self);
    pAVar5 = (Am_Value *)Am_Object::Get((ushort)local_38,0x82);
    Am_Value_List::Am_Value_List(local_30,pAVar5);
    Am_Object::~Am_Object(local_38);
    bVar2 = Am_Value_List::Valid();
    if ((bVar2 & 1) == 0) {
LAB_001045b4:
      self_local = (Am_Object *)Am_Object::operator_cast_to_Am_Wrapper_((Am_Object *)&Am_No_Object);
    }
    else {
      Am_Value_List::Move_Nth((int)local_30);
      Am_Value_List::Next();
      do {
        bVar2 = Am_Value_List::Last();
        if (((bVar2 ^ 0xff) & 1) == 0) goto LAB_001045b4;
        pAVar5 = (Am_Value *)Am_Value_List::Get();
        Am_Object::Am_Object(local_50,pAVar5);
        pAVar5 = (Am_Value *)Am_Object::Get((ushort)local_50,(ulong)PARENT);
        iVar3 = Am_Value::operator_cast_to_int(pAVar5);
        if (iVar3 == iVar4) {
          pAVar5 = (Am_Value *)Am_Object::Get((ushort)local_50,0x85);
          iVar3 = Am_Value::operator_cast_to_int(pAVar5);
          if (iVar3 == iVar4) goto LAB_00104589;
          self_local = (Am_Object *)Am_Object::operator_cast_to_Am_Wrapper_(local_50);
          bVar1 = true;
        }
        else {
LAB_00104589:
          Am_Value_List::Next();
          bVar1 = false;
        }
        Am_Object::~Am_Object(local_50);
      } while (!bVar1);
    }
    Am_Value_List::~Am_Value_List(local_30);
  }
  return (Am_Wrapper *)self_local;
}

Assistant:

Am_Define_Object_Formula(find_prev_child)
{
  int rank = self.Get(Am_RANK);
  int parent_rank = self.Get(PARENT);
  if (rank == parent_rank)
    return Am_No_Object;
  Am_Value_List nodes = self.Get_Owner().Get(Am_GRAPHICAL_PARTS);
  if (nodes.Valid()) {
    nodes.Move_Nth(rank);
    nodes.Next();
    while (!nodes.Last()) {
      Am_Object item = nodes.Get();
      if ((int)item.Get(PARENT) == parent_rank &&
          (int)item.Get(Am_RANK) != parent_rank)
        return item;
      nodes.Next();
    }
  }
  return Am_No_Object;
}